

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_load(lua_State *L)

{
  int iVar1;
  int status;
  size_t in_RAX;
  char *pcVar2;
  char *mode;
  char *name;
  size_t l;
  size_t local_28;
  
  local_28 = in_RAX;
  pcVar2 = lua_tolstring(L,1,&local_28);
  mode = luaL_optlstring(L,3,"bt",(size_t *)0x0);
  iVar1 = lua_type(L,4);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = luaL_optlstring(L,2,"=(load)",(size_t *)0x0);
    luaL_checktype(L,1,6);
    lua_settop(L,5);
    status = lua_load(L,generic_reader,(void *)0x0,pcVar2,mode);
  }
  else {
    name = luaL_optlstring(L,2,pcVar2,(size_t *)0x0);
    status = luaL_loadbufferx(L,pcVar2,local_28,name,mode);
  }
  iVar1 = load_aux(L,status,(uint)(iVar1 != -1) << 2);
  return iVar1;
}

Assistant:

static int luaB_load (lua_State *L) {
  int status;
  size_t l;
  const char *s = lua_tolstring(L, 1, &l);
  const char *mode = luaL_optstring(L, 3, "bt");
  int env = (!lua_isnone(L, 4) ? 4 : 0);  /* 'env' index or 0 if no 'env' */
  if (s != NULL) {  /* loading a string? */
    const char *chunkname = luaL_optstring(L, 2, s);
    status = luaL_loadbufferx(L, s, l, chunkname, mode);
  }
  else {  /* loading from a reader function */
    const char *chunkname = luaL_optstring(L, 2, "=(load)");
    luaL_checktype(L, 1, LUA_TFUNCTION);
    lua_settop(L, RESERVEDSLOT);  /* create reserved slot */
    status = lua_load(L, generic_reader, NULL, chunkname, mode);
  }
  return load_aux(L, status, env);
}